

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O1

void __thiscall polyscope::TransformationGizmo::draw(TransformationGizmo *this)

{
  mat4 *pmVar1;
  element_type *peVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  uint *puVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar41;
  float fVar42;
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  float fVar46;
  float fVar47;
  undefined1 auVar45 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  vec4 vVar56;
  mat4 projMat;
  mat4 viewMat;
  mat4 Pinv;
  mat4 P;
  uint local_390;
  uint local_38c;
  undefined8 local_388;
  undefined8 local_380;
  float local_378;
  undefined4 uStack_374;
  undefined8 uStack_370;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  undefined1 local_f0 [64];
  undefined1 local_b0 [64];
  mat<4,_4,_float,_(glm::qualifier)0> local_70;
  
  if ((this->enabled).value == true) {
    if ((this->ringProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prepare(this);
    }
    pmVar1 = this->T;
    fVar31 = pmVar1->value[0].field_0.x;
    fVar52 = pmVar1->value[0].field_1.y;
    fVar53 = pmVar1->value[0].field_2.z;
    fVar31 = fVar31 * fVar31 + fVar52 * fVar52 + fVar53 * fVar53;
    if (fVar31 < 0.0) {
      fVar31 = sqrtf(fVar31);
    }
    else {
      auVar26 = vsqrtss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
      fVar31 = auVar26._0_4_;
    }
    dVar7 = (double)this->gizmoSizeRel * state::lengthScale;
    uStack_374 = (undefined4)((ulong)dVar7 >> 0x20);
    local_378 = (float)dVar7;
    uStack_370 = 0;
    view::getCameraViewMatrix();
    pmVar1 = this->T;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_130;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_128;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_120;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_118;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_110;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_108;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_100;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_f8;
    auVar26._4_4_ = uStack_374;
    auVar26._0_4_ = local_378;
    auVar26._8_8_ = uStack_370;
    auVar10 = vmulss_avx512f(auVar26,ZEXT416(0));
    fVar52 = pmVar1->value[0].field_0.x;
    fVar53 = pmVar1->value[0].field_1.y;
    fVar54 = pmVar1->value[0].field_2.z;
    fVar55 = pmVar1->value[0].field_3.w;
    auVar11 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[1].field_0));
    auVar33._0_4_ =
         fVar52 * (float)local_130 + fVar53 * (float)local_120 + (float)local_110 * fVar54 +
         (float)local_100 * fVar55;
    auVar33._4_4_ =
         fVar52 * (float)(local_130 >> 0x20) + fVar53 * (float)(local_120 >> 0x20) +
         (float)(local_110 >> 0x20) * fVar54 + (float)(local_100 >> 0x20) * fVar55;
    auVar33._8_4_ = fVar52 * 0.0 + fVar53 * 0.0 + fVar54 * 0.0 + fVar55 * 0.0;
    auVar33._12_4_ = fVar52 * 0.0 + fVar53 * 0.0 + fVar54 * 0.0 + fVar55 * 0.0;
    auVar12 = vmulps_avx512vl(auVar22,auVar11);
    auVar13 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[1].field_1));
    auVar14 = vmulps_avx512vl(auVar23,auVar13);
    auVar15 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[1].field_2));
    auVar16 = vmulps_avx512vl(auVar40,auVar15);
    auVar17 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[1].field_3));
    auVar18 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[2].field_0));
    auVar19 = vmulps_avx512vl(auVar45,auVar17);
    auVar32._0_4_ = auVar19._0_4_ + auVar16._0_4_ + auVar14._0_4_ + auVar12._0_4_;
    auVar32._4_4_ = auVar19._4_4_ + auVar16._4_4_ + auVar14._4_4_ + auVar12._4_4_;
    auVar32._8_4_ = auVar19._8_4_ + auVar16._8_4_ + auVar14._8_4_ + auVar12._8_4_;
    auVar32._12_4_ = auVar19._12_4_ + auVar16._12_4_ + auVar14._12_4_ + auVar12._12_4_;
    auVar12 = vmulps_avx512vl(auVar22,auVar18);
    auVar14 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[2].field_1));
    auVar16 = vmulps_avx512vl(auVar23,auVar14);
    auVar12 = vaddps_avx512vl(auVar12,auVar16);
    auVar16 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[2].field_2));
    auVar19 = vmulps_avx512vl(auVar40,auVar16);
    auVar12 = vaddps_avx512vl(auVar12,auVar19);
    auVar19 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[2].field_3));
    auVar20 = vmulps_avx512vl(auVar45,auVar19);
    auVar12 = vaddps_avx512vl(auVar12,auVar20);
    auVar20 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[3].field_0));
    auVar21 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[3].field_1));
    auVar22 = vmulps_avx512vl(auVar22,auVar20);
    auVar23 = vmulps_avx512vl(auVar23,auVar21);
    auVar24 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[3].field_2));
    auVar25 = vmulps_avx512vl(auVar40,auVar24);
    auVar38._0_4_ = auVar22._0_4_ + auVar23._0_4_ + auVar25._0_4_;
    auVar38._4_4_ = auVar22._4_4_ + auVar23._4_4_ + auVar25._4_4_;
    auVar38._8_4_ = auVar22._8_4_ + auVar23._8_4_ + auVar25._8_4_;
    auVar38._12_4_ = auVar22._12_4_ + auVar23._12_4_ + auVar25._12_4_;
    auVar22 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar1->value[3].field_3));
    auVar23 = vmulps_avx512vl(auVar45,auVar22);
    auVar23 = vaddps_avx512vl(auVar38,auVar23);
    auVar26 = vbroadcastss_avx512vl(auVar26);
    fVar3 = auVar26._0_4_;
    auVar25._0_4_ = auVar33._0_4_ * fVar3;
    fVar4 = auVar26._4_4_;
    auVar25._4_4_ = auVar33._4_4_ * fVar4;
    fVar5 = auVar26._8_4_;
    auVar25._8_4_ = auVar33._8_4_ * fVar5;
    fVar6 = auVar26._12_4_;
    auVar25._12_4_ = auVar33._12_4_ * fVar6;
    auVar49._0_4_ = auVar10._0_4_;
    auVar49._4_4_ = auVar49._0_4_;
    auVar49._8_4_ = auVar49._0_4_;
    auVar49._12_4_ = auVar49._0_4_;
    auVar26 = vmulps_avx512vl(auVar49,auVar32);
    auVar10 = vaddps_avx512vl(auVar25,auVar26);
    fVar39 = auVar49._0_4_ * auVar12._0_4_;
    fVar41 = auVar49._0_4_ * auVar12._4_4_;
    fVar42 = auVar49._0_4_ * auVar12._8_4_;
    fVar43 = auVar49._0_4_ * auVar12._12_4_;
    auVar25 = vmulps_avx512vl(auVar49,auVar23);
    fVar44 = auVar25._0_4_;
    fVar46 = auVar25._4_4_;
    fVar47 = auVar25._8_4_;
    fVar48 = auVar25._12_4_;
    auVar50._0_4_ =
         fVar52 * (float)local_128 + fVar53 * (float)local_118 + fVar54 * (float)local_108 +
         fVar55 * (float)local_f8;
    auVar50._4_4_ =
         fVar52 * (float)(local_128 >> 0x20) + fVar53 * (float)(local_118 >> 0x20) +
         fVar54 * (float)(local_108 >> 0x20) + fVar55 * (float)(local_f8 >> 0x20);
    auVar50._8_4_ = fVar52 * 0.0 + fVar53 * 0.0 + fVar54 * 0.0 + fVar55 * 0.0;
    auVar50._12_4_ = fVar52 * 0.0 + fVar53 * 0.0 + fVar54 * 0.0 + fVar55 * 0.0;
    auVar25 = vmulps_avx512vl(auVar34,auVar11);
    auVar13 = vmulps_avx512vl(auVar35,auVar13);
    auVar15 = vmulps_avx512vl(auVar36,auVar15);
    auVar17 = vmulps_avx512vl(auVar37,auVar17);
    auVar51._0_4_ = auVar25._0_4_ + auVar13._0_4_ + auVar15._0_4_ + auVar17._0_4_;
    auVar51._4_4_ = auVar25._4_4_ + auVar13._4_4_ + auVar15._4_4_ + auVar17._4_4_;
    auVar51._8_4_ = auVar25._8_4_ + auVar13._8_4_ + auVar15._8_4_ + auVar17._8_4_;
    auVar51._12_4_ = auVar25._12_4_ + auVar13._12_4_ + auVar15._12_4_ + auVar17._12_4_;
    auVar13 = vmulps_avx512vl(auVar34,auVar18);
    auVar14 = vmulps_avx512vl(auVar35,auVar14);
    auVar15 = vmulps_avx512vl(auVar36,auVar16);
    auVar16 = vmulps_avx512vl(auVar37,auVar19);
    auVar18._0_4_ = auVar13._0_4_ + auVar14._0_4_ + auVar15._0_4_ + auVar16._0_4_;
    auVar18._4_4_ = auVar13._4_4_ + auVar14._4_4_ + auVar15._4_4_ + auVar16._4_4_;
    auVar18._8_4_ = auVar13._8_4_ + auVar14._8_4_ + auVar15._8_4_ + auVar16._8_4_;
    auVar18._12_4_ = auVar13._12_4_ + auVar14._12_4_ + auVar15._12_4_ + auVar16._12_4_;
    auVar13 = vmulps_avx512vl(auVar34,auVar20);
    auVar14 = vmulps_avx512vl(auVar35,auVar21);
    auVar15 = vmulps_avx512vl(auVar36,auVar24);
    auVar16 = vmulps_avx512vl(auVar37,auVar22);
    auVar17._0_4_ = auVar13._0_4_ + auVar14._0_4_ + auVar15._0_4_ + auVar16._0_4_;
    auVar17._4_4_ = auVar13._4_4_ + auVar14._4_4_ + auVar15._4_4_ + auVar16._4_4_;
    auVar17._8_4_ = auVar13._8_4_ + auVar14._8_4_ + auVar15._8_4_ + auVar16._8_4_;
    auVar17._12_4_ = auVar13._12_4_ + auVar14._12_4_ + auVar15._12_4_ + auVar16._12_4_;
    fVar52 = auVar49._0_4_ * auVar17._0_4_;
    fVar53 = auVar49._0_4_ * auVar17._4_4_;
    fVar54 = auVar49._0_4_ * auVar17._8_4_;
    fVar55 = auVar49._0_4_ * auVar17._12_4_;
    auVar16._0_4_ =
         fVar52 + auVar50._0_4_ * fVar3 + auVar49._0_4_ * auVar51._0_4_ +
                  auVar49._0_4_ * auVar18._0_4_;
    auVar16._4_4_ =
         fVar53 + auVar50._4_4_ * fVar4 + auVar49._0_4_ * auVar51._4_4_ +
                  auVar49._0_4_ * auVar18._4_4_;
    auVar16._8_4_ =
         fVar54 + auVar50._8_4_ * fVar5 + auVar49._0_4_ * auVar51._8_4_ +
                  auVar49._0_4_ * auVar18._8_4_;
    auVar16._12_4_ =
         fVar55 + auVar50._12_4_ * fVar6 + auVar49._0_4_ * auVar51._12_4_ +
                  auVar49._0_4_ * auVar18._12_4_;
    auVar11 = vxorps_avx512vl(auVar11,auVar11);
    auVar13 = vmulps_avx512vl(auVar33,auVar11);
    auVar14 = vmulps_avx512vl(auVar32,auVar11);
    auVar13 = vaddps_avx512vl(auVar13,auVar14);
    auVar14 = vmulps_avx512vl(auVar12,auVar11);
    auVar13 = vaddps_avx512vl(auVar13,auVar14);
    auVar13 = vaddps_avx512vl(auVar13,auVar23);
    auVar14 = vmulps_avx512vl(auVar50,auVar11);
    auVar15 = vmulps_avx512vl(auVar51,auVar11);
    auVar14 = vaddps_avx512vl(auVar14,auVar15);
    auVar11 = vmulps_avx512vl(auVar18,auVar11);
    auVar11 = vaddps_avx512vl(auVar14,auVar11);
    auVar11 = vaddps_avx512vl(auVar11,auVar17);
    auVar28 = vinsertf32x4_avx512f(ZEXT1664(auVar13),auVar11,1);
    auVar11._0_4_ = auVar49._0_4_ * auVar33._0_4_;
    auVar11._4_4_ = auVar49._0_4_ * auVar33._4_4_;
    auVar11._8_4_ = auVar49._0_4_ * auVar33._8_4_;
    auVar11._12_4_ = auVar49._0_4_ * auVar33._12_4_;
    auVar26 = vaddps_avx512vl(auVar11,auVar26);
    auVar14._0_4_ = auVar12._0_4_ * fVar3;
    auVar14._4_4_ = auVar12._4_4_ * fVar4;
    auVar14._8_4_ = auVar12._8_4_ * fVar5;
    auVar14._12_4_ = auVar12._12_4_ * fVar6;
    auVar26 = vaddps_avx512vl(auVar26,auVar14);
    auVar13._0_4_ =
         fVar52 + auVar18._0_4_ * fVar3 +
                  auVar49._0_4_ * auVar50._0_4_ + auVar49._0_4_ * auVar51._0_4_;
    auVar13._4_4_ =
         fVar53 + auVar18._4_4_ * fVar4 +
                  auVar49._0_4_ * auVar50._4_4_ + auVar49._0_4_ * auVar51._4_4_;
    auVar13._8_4_ =
         fVar54 + auVar18._8_4_ * fVar5 +
                  auVar49._0_4_ * auVar50._8_4_ + auVar49._0_4_ * auVar51._8_4_;
    auVar13._12_4_ =
         fVar55 + auVar18._12_4_ * fVar6 +
                  auVar49._0_4_ * auVar50._12_4_ + auVar49._0_4_ * auVar51._12_4_;
    auVar29 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar26._12_4_ + fVar48,
                                            CONCAT48(auVar26._8_4_ + fVar47,
                                                     CONCAT44(auVar26._4_4_ + fVar46,
                                                              auVar26._0_4_ + fVar44)))),auVar13,1);
    auVar30 = vbroadcasti64x4_avx512f(_DAT_0029ef40);
    auVar28 = vpermi2pd_avx512f(auVar30,auVar29,auVar28);
    auVar12._0_4_ =
         fVar52 + auVar49._0_4_ * auVar50._0_4_ + auVar51._0_4_ * fVar3 +
                  auVar49._0_4_ * auVar18._0_4_;
    auVar12._4_4_ =
         fVar53 + auVar49._0_4_ * auVar50._4_4_ + auVar51._4_4_ * fVar4 +
                  auVar49._0_4_ * auVar18._4_4_;
    auVar12._8_4_ =
         fVar54 + auVar49._0_4_ * auVar50._8_4_ + auVar51._8_4_ * fVar5 +
                  auVar49._0_4_ * auVar18._8_4_;
    auVar12._12_4_ =
         fVar55 + auVar49._0_4_ * auVar50._12_4_ + auVar51._12_4_ * fVar6 +
                  auVar49._0_4_ * auVar18._12_4_;
    auVar29 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(fVar48 + fVar43 + auVar11._12_4_ +
                                                              auVar32._12_4_ * fVar6,
                                            CONCAT48(fVar47 + fVar42 + auVar11._8_4_ +
                                                                       auVar32._8_4_ * fVar5,
                                                     CONCAT44(fVar46 + fVar41 + auVar11._4_4_ +
                                                                                auVar32._4_4_ *
                                                                                fVar4,
                                                              fVar44 + fVar39 + auVar11._0_4_ +
                                                                                auVar32._0_4_ *
                                                                                fVar3)))),auVar12,1)
    ;
    auVar30 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(fVar48 + fVar43 + auVar10._12_4_,
                                            CONCAT48(fVar47 + fVar42 + auVar10._8_4_,
                                                     CONCAT44(fVar46 + fVar41 + auVar10._4_4_,
                                                              fVar44 + fVar39 + auVar10._0_4_)))),
                         auVar16,1);
    auVar27 = vpermi2pd_avx512vl(_DAT_0029ef60,auVar30._0_32_,auVar29._0_32_);
    local_f0 = vinsertf64x4_avx512f(auVar28,auVar27,0);
    peVar2 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"u_modelView","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,(string *)local_150,local_f0);
    if (local_150[0] != local_140) {
      operator_delete(local_150[0]);
    }
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"u_modelView","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,(string *)local_170,local_f0);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0]);
    }
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"u_modelView","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,(string *)local_190,local_f0);
    if (local_190[0] != local_180) {
      operator_delete(local_190[0]);
    }
    view::getCameraPerspectiveMatrix();
    peVar2 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1b0[0] = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"u_projMatrix","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_1b0,&local_130);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0]);
    }
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"u_projMatrix","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_1d0,&local_130);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"u_projMatrix","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_1f0,&local_130);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
    peVar2 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_210[0] = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"u_diskWidthRel","");
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)this->diskWidthObj,peVar2,local_210);
    if (local_210[0] != local_200) {
      operator_delete(local_210[0]);
    }
    local_380 = 0;
    local_38c = 0;
    local_388 = 0;
    local_390 = 0;
    if (this->selectedType == Rotation) {
      if (this->selectedDim == 2) {
        puVar8 = &local_38c;
      }
      else if (this->selectedDim == 1) {
        puVar8 = (uint *)((long)&local_380 + 4);
      }
      else {
        puVar8 = (uint *)&local_380;
      }
      *puVar8 = 0x3f800000;
    }
    peVar2 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_230[0] = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"u_active","");
    (*peVar2->_vptr_ShaderProgram[9])(local_380,(ulong)local_38c,peVar2,local_230);
    if (local_230[0] != local_220) {
      operator_delete(local_230[0]);
    }
    if (this->selectedType == Translation) {
      if (this->selectedDim == 2) {
        puVar8 = &local_390;
      }
      else if (this->selectedDim == 1) {
        puVar8 = (uint *)((long)&local_388 + 4);
      }
      else {
        puVar8 = (uint *)&local_388;
      }
      *puVar8 = 0x3f800000;
    }
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"u_active","");
    (*peVar2->_vptr_ShaderProgram[9])(local_388,(ulong)local_390,peVar2,local_250);
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    bVar9 = this->selectedType == Scale;
    if (bVar9) {
      uStack_35c = 0x3f733333;
      local_368 = 0x3f733333;
      uStack_364 = 0x3f733333;
      uStack_360 = 0x3f733333;
    }
    else {
      uStack_35c = 0x3f59999a;
      local_368 = 0x3f59999a;
      uStack_364 = 0x3f59999a;
      uStack_360 = 0x3f59999a;
    }
    view::getCameraPerspectiveMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_70);
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"u_invProjMatrix","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_270,local_b0);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_290[0] = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"u_viewport","");
    vVar56 = render::Engine::getCurrentViewport(render::engine);
    (*peVar2->_vptr_ShaderProgram[10])(vVar56._0_8_,vVar56._8_8_,peVar2,local_290);
    if (local_290[0] != local_280) {
      operator_delete(local_290[0]);
    }
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2b0[0] = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"u_lengthMult","");
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)this->vecLength,peVar2,local_2b0);
    if (local_2b0[0] != local_2a0) {
      operator_delete(local_2b0[0]);
    }
    peVar2 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"u_radius","");
    local_378 = local_378 * fVar31;
    (*peVar2->_vptr_ShaderProgram[6])((double)local_378 * 0.2,peVar2,local_2d0);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0]);
    }
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2f0[0] = local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"u_invProjMatrix","");
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_2f0,local_b0);
    if (local_2f0[0] != local_2e0) {
      operator_delete(local_2f0[0]);
    }
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_310[0] = local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"u_viewport","");
    vVar56 = render::Engine::getCurrentViewport(render::engine);
    (*peVar2->_vptr_ShaderProgram[10])(vVar56._0_8_,vVar56._8_8_,peVar2,local_310);
    if (local_310[0] != local_300) {
      operator_delete(local_310[0]);
    }
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_330[0] = local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"u_pointRadius","");
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)(local_378 * this->sphereRad),peVar2,local_330);
    if (local_330[0] != local_320) {
      operator_delete(local_330[0]);
    }
    peVar2 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"u_baseColor","");
    (*peVar2->_vptr_ShaderProgram[9])
              (CONCAT44(uStack_364,local_368),
               (ulong)((uint)bVar9 * 0x3f733333 + (uint)!bVar9 * 0x3f59999a),peVar2,local_350);
    if (local_350[0] != local_340) {
      operator_delete(local_350[0]);
    }
    (*render::engine->_vptr_Engine[10])(render::engine,0);
    (*render::engine->_vptr_Engine[0xb])(render::engine,0);
    (*render::engine->_vptr_Engine[0xd])(render::engine,0);
    (*((this->ringProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    (*((this->arrowProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    (*((this->sphereProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void TransformationGizmo::draw() {
  if (!enabled.get()) return;
  if (!ringProgram) prepare();

  // == set uniforms

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSizePreTrans = gizmoSizeRel * state::lengthScale;
  float gizmoSize = transScale * gizmoSizePreTrans;

  glm::mat4 viewMat =
      view::getCameraViewMatrix() * T * glm::scale(glm::vec3{gizmoSizePreTrans, gizmoSizePreTrans, gizmoSizePreTrans});
  ringProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  arrowProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  sphereProgram->setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  ringProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  arrowProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  sphereProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  ringProgram->setUniform("u_diskWidthRel", diskWidthObj);

  // set selections
  glm::vec3 selectRot{0., 0., 0.};
  glm::vec3 selectTrans{0., 0., 0.};
  glm::vec3 sphereColor(0.85);
  if (selectedType == TransformHandle::Rotation) {
    selectRot[selectedDim] = 1.;
  }
  ringProgram->setUniform("u_active", selectRot);
  if (selectedType == TransformHandle::Translation) {
    selectTrans[selectedDim] = 1.;
  }
  arrowProgram->setUniform("u_active", selectTrans);
  if (selectedType == TransformHandle::Scale) {
    sphereColor = glm::vec3(0.95);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  arrowProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  arrowProgram->setUniform("u_viewport", render::engine->getCurrentViewport());
  arrowProgram->setUniform("u_lengthMult", vecLength);
  arrowProgram->setUniform("u_radius", 0.2 * gizmoSize);

  sphereProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  sphereProgram->setUniform("u_viewport", render::engine->getCurrentViewport());

  sphereProgram->setUniform("u_pointRadius", sphereRad * gizmoSize);
  sphereProgram->setUniform("u_baseColor", sphereColor);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBlendMode();
  render::engine->setBackfaceCull(false);

  // == draw

  ringProgram->draw();
  arrowProgram->draw();
  sphereProgram->draw();
}